

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

bool s2textformat::MakeCellUnion(string_view str,S2CellUnion *cell_union)

{
  pointer pSVar1;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type sVar2;
  S2Region SVar3;
  char in_R8B;
  string_view *cell_str;
  S2Region SVar4;
  bool bVar5;
  string_view str_00;
  string_view str_01;
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  S2CellId cell_id;
  pointer local_78;
  iterator iStack_70;
  pointer local_68;
  S2CellId local_58;
  S2CellUnion local_50;
  size_type extraout_RDX;
  
  local_78 = (pointer)0x0;
  iStack_70._M_current = (pointer)0x0;
  local_68 = (pointer)0x0;
  str_01.length_ = 0x2c;
  str_01.ptr_ = (char *)str.length_;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)&local_50,
              (s2textformat *)str.ptr_,str_01,in_R8B);
  pSVar1 = local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = (pointer)local_50.super_S2Region._vptr_S2Region ==
          local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (!bVar5) {
    sVar2 = extraout_RDX;
    SVar4._vptr_S2Region = local_50.super_S2Region._vptr_S2Region;
    do {
      local_58.id_ = 0;
      str_00.length_ = sVar2;
      str_00.ptr_ = (char *)((pointer)SVar4._vptr_S2Region)[1].id_;
      local_58 = S2CellId::FromDebugString((S2CellId *)((pointer)SVar4._vptr_S2Region)->id_,str_00);
      SVar3._vptr_S2Region = local_50.super_S2Region._vptr_S2Region;
      if (local_58.id_ == 0) goto LAB_0022e860;
      if (iStack_70._M_current == local_68) {
        std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                  ((vector<S2CellId,std::allocator<S2CellId>> *)&local_78,iStack_70,&local_58);
        sVar2 = extraout_RDX_01;
      }
      else {
        (iStack_70._M_current)->id_ = local_58.id_;
        iStack_70._M_current = iStack_70._M_current + 1;
        sVar2 = extraout_RDX_00;
      }
      SVar4._vptr_S2Region = SVar4._vptr_S2Region + 2;
      bVar5 = (pointer)SVar4._vptr_S2Region == pSVar1;
    } while (!bVar5);
  }
  if (local_50.super_S2Region._vptr_S2Region != (_func_int **)0x0) {
    operator_delete(local_50.super_S2Region._vptr_S2Region);
  }
  local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)iStack_70;
  local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = local_78;
  local_78 = (pointer)0x0;
  iStack_70._M_current = (S2CellId *)0x0;
  local_68 = (pointer)0x0;
  local_50.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002c1838;
  S2CellUnion::Normalize(&local_50);
  pSVar1 = (cell_union->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  (cell_union->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_start;
  (cell_union->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (cell_union->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar3._vptr_S2Region =
       (_func_int **)
       local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
    SVar3._vptr_S2Region =
         (_func_int **)
         local_50.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
LAB_0022e860:
  if ((pointer)SVar3._vptr_S2Region != (pointer)0x0) {
    operator_delete(SVar3._vptr_S2Region);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  return bVar5;
}

Assistant:

bool MakeCellUnion(string_view str, S2CellUnion* cell_union) {
  vector<S2CellId> cell_ids;
  for (const auto& cell_str : SplitString(str, ',')) {
    S2CellId cell_id;
    if (!MakeCellId(cell_str, &cell_id)) return false;
    cell_ids.push_back(cell_id);
  }
  *cell_union = S2CellUnion(std::move(cell_ids));
  return true;
}